

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Chunk *chunk)

{
  long lVar1;
  ostream *poVar2;
  uint x;
  long lVar3;
  uint y;
  long lVar4;
  
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      lVar1 = *(long *)out;
      *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 8;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(out + lVar1 + 0x18) = *(uint *)(out + lVar1 + 0x18) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::operator<<(poVar2," ");
    }
    std::operator<<(out,"\n");
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Chunk& chunk) {
    for (unsigned int y = 0; y < Chunk::WIDTH; ++y) {
        for (unsigned int x = 0; x < Chunk::WIDTH; ++x) {
            out << std::setw(8) << std::hex << *reinterpret_cast<const uint32_t*>(&chunk.tiles_[y * Chunk::WIDTH + x]) << std::dec << " ";
        }
        out << "\n";
    }
    return out;
}